

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[18],kj::StringPtr&,kj::String&,char_const(&)[17]>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],StringPtr *params_1,
          String *params_2,char (*params_3) [17])

{
  char *pcVar1;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_50 = toCharSequence<char_const(&)[18]>((char (*) [18])this);
  local_60.ptr = *(char **)*params;
  local_60.size_ = *(long *)(*params + 8) - 1;
  pcVar1 = (char *)(params_1->content).size_;
  local_30.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_30.ptr = (params_1->content).ptr;
  }
  local_30.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_30.size_ = (size_t)(pcVar1 + -1);
  }
  local_40 = toCharSequence<char_const(&)[17]>((char (*) [17])params_2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,&local_30,&local_40,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}